

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_print(_func_void_void_ptr_char_ptr *write_cb,void *cbopaque,char *opts)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  _Bool merged;
  char *pcVar6;
  bool bVar7;
  _Bool large;
  _Bool bins;
  _Bool mutex;
  _Bool extents;
  _Bool unmerged;
  _Bool destroyed;
  emitter_t local_68;
  void *local_48;
  size_t u64sz;
  uint64_t epoch;
  
  epoch = 1;
  u64sz = 8;
  iVar3 = je_mallctl("epoch",&epoch,&u64sz,&epoch,8);
  if (iVar3 != 0) {
    if (iVar3 == 0xb) {
      malloc_write("<jemalloc>: Memory allocation failure in mallctl(\"epoch\", ...)\n");
      return;
    }
    malloc_write("<jemalloc>: Failure in mallctl(\"epoch\", ...)\n");
    abort();
  }
  if (opts != (char *)0x0) {
    bVar2 = 0;
    bVar7 = true;
    merged = true;
    destroyed = true;
    unmerged = true;
    bins = true;
    large = true;
    mutex = true;
    extents = true;
    uVar5 = 0;
    do {
      bVar1 = opts[uVar5];
      if (bVar1 < 0x61) {
        if (bVar1 == 0x4a) {
          bVar2 = 1;
        }
        else if (bVar1 == 0) goto LAB_0013c056;
      }
      else {
        switch(bVar1) {
        case 0x61:
          unmerged = false;
          break;
        case 0x62:
          bins = false;
          break;
        case 99:
        case 0x66:
        case 0x68:
        case 0x69:
        case 0x6a:
        case 0x6b:
          break;
        case 100:
          destroyed = false;
          break;
        case 0x65:
          extents = false;
          break;
        case 0x67:
          bVar7 = false;
          break;
        case 0x6c:
          large = false;
          break;
        case 0x6d:
          merged = false;
          break;
        default:
          if (bVar1 == 0x78) {
            mutex = false;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  bVar7 = true;
  local_68.output = emitter_output_table;
  merged = true;
  destroyed = true;
  unmerged = true;
  bins = true;
  large = true;
  mutex = true;
  extents = true;
LAB_0013c07b:
  local_68.item_at_depth = false;
  local_68.emitted_key = false;
  local_68.nesting_depth = 0;
  local_68.write_cb = write_cb;
  local_68.cbopaque = cbopaque;
  local_48 = cbopaque;
  if (local_68.output == emitter_output_json) {
    emitter_printf(&local_68,"{");
    local_68.nesting_depth = 1;
    local_68._28_2_ = local_68._28_2_ & 0xff00;
    emitter_table_printf(&local_68,"___ Begin jemalloc statistics ___\n");
    emitter_printf(&local_68,"%s\n","");
    emitter_printf(&local_68,"%s","\t");
    emitter_printf(&local_68,"\"%s\": ","jemalloc");
    local_68._28_2_ = local_68._28_2_ & 0xff;
    emitter_printf(&local_68,"{");
    local_68.nesting_depth = 2;
    local_68._28_2_ = local_68._28_2_ & 0xff00;
  }
  else {
    emitter_printf(&local_68,"%s","");
    emitter_table_printf(&local_68,"___ Begin jemalloc statistics ___\n");
  }
  if (bVar7) {
    stats_general_print(&local_68);
  }
  stats_print_helper(&local_68,merged,destroyed,unmerged,bins,large,mutex,extents);
  if (local_68.output == emitter_output_json) {
    local_68.nesting_depth = local_68.nesting_depth + -1;
    local_68.item_at_depth = true;
    emitter_printf(&local_68,"\n");
    pcVar6 = "\t";
    if (local_68.output != emitter_output_json) {
      pcVar6 = " ";
    }
    if (0 < local_68.nesting_depth) {
      iVar4 = local_68.nesting_depth << (local_68.output != emitter_output_json);
      iVar3 = 1;
      if (1 < iVar4) {
        iVar3 = iVar4;
      }
      do {
        emitter_printf(&local_68,"%s",pcVar6);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    emitter_printf(&local_68,"}");
  }
  emitter_table_printf(&local_68,"--- End jemalloc statistics ---\n");
  if (local_68.output == emitter_output_json) {
    local_68.nesting_depth = local_68.nesting_depth + -1;
    local_68.item_at_depth = true;
    emitter_printf(&local_68,"\n}\n");
  }
  return;
LAB_0013c056:
  local_68.output = (emitter_output_t)(~bVar2 & 1);
  goto LAB_0013c07b;
}

Assistant:

void
stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	int err;
	uint64_t epoch;
	size_t u64sz;
#define OPTION(o, v, d, s) bool v = d;
	STATS_PRINT_OPTIONS
#undef OPTION

	/*
	 * Refresh stats, in case mallctl() was called by the application.
	 *
	 * Check for OOM here, since refreshing the ctl cache can trigger
	 * allocation.  In practice, none of the subsequent mallctl()-related
	 * calls in this function will cause OOM if this one succeeds.
	 * */
	epoch = 1;
	u64sz = sizeof(uint64_t);
	err = je_mallctl("epoch", (void *)&epoch, &u64sz, (void *)&epoch,
	    sizeof(uint64_t));
	if (err != 0) {
		if (err == EAGAIN) {
			malloc_write("<jemalloc>: Memory allocation failure in "
			    "mallctl(\"epoch\", ...)\n");
			return;
		}
		malloc_write("<jemalloc>: Failure in mallctl(\"epoch\", "
		    "...)\n");
		abort();
	}

	if (opts != NULL) {
		for (unsigned i = 0; opts[i] != '\0'; i++) {
			switch (opts[i]) {
#define OPTION(o, v, d, s) case o: v = s; break;
				STATS_PRINT_OPTIONS
#undef OPTION
			default:;
			}
		}
	}

	emitter_t emitter;
	emitter_init(&emitter,
	    json ? emitter_output_json : emitter_output_table, write_cb,
	    cbopaque);
	emitter_begin(&emitter);
	emitter_table_printf(&emitter, "___ Begin jemalloc statistics ___\n");
	emitter_json_object_kv_begin(&emitter, "jemalloc");

	if (general) {
		stats_general_print(&emitter);
	}
	if (config_stats) {
		stats_print_helper(&emitter, merged, destroyed, unmerged,
		    bins, large, mutex, extents);
	}

	emitter_json_object_end(&emitter); /* Closes the "jemalloc" dict. */
	emitter_table_printf(&emitter, "--- End jemalloc statistics ---\n");
	emitter_end(&emitter);
}